

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O1

int run_test_tcp_create_early(void)

{
  ushort uVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  ulong uVar4;
  uv_loop_t *puVar5;
  uv_loop_t *unaff_RBX;
  anon_union_28_2_e90107a3_for_address *paVar6;
  char *handle;
  bool bVar7;
  int namelen;
  uv_os_fd_t fd;
  sockaddr_in sockname;
  sockaddr_in addr;
  uv_tcp_t client;
  sockaddr_in sStack_5e0;
  uv_tcp_t uStack_5d0;
  undefined1 auStack_4d8 [360];
  uv_tcp_t uStack_370;
  uv_loop_t *puStack_278;
  int aiStack_264 [2];
  sockaddr sStack_25c;
  sockaddr_in sStack_240;
  uv_tcp_t uStack_230;
  uv_loop_t *puStack_138;
  int local_128;
  int local_124;
  sockaddr local_120;
  sockaddr_in local_110;
  uv_tcp_t local_100;
  
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&local_110);
  if (iVar2 == 0) {
    puVar3 = uv_default_loop();
    iVar2 = uv_tcp_init_ex(puVar3,&local_100,2);
    if (iVar2 != 0) goto LAB_0016fcfd;
    iVar2 = uv_fileno((uv_handle_t *)&local_100,&local_124);
    if (iVar2 != 0) goto LAB_0016fd02;
    if (local_124 == -1) goto LAB_0016fd07;
    local_128 = 0x10;
    iVar2 = uv_tcp_getsockname(&local_100,&local_120,&local_128);
    if (iVar2 != 0) goto LAB_0016fd0c;
    if (local_120.sa_family != 2) goto LAB_0016fd11;
    iVar2 = uv_tcp_bind(&local_100,(sockaddr *)&local_110,0);
    if (iVar2 != 0) goto LAB_0016fd16;
    local_128 = 0x10;
    iVar2 = uv_tcp_getsockname(&local_100,&local_120,&local_128);
    if (iVar2 != 0) goto LAB_0016fd1b;
    if (local_110.sin_addr.s_addr != local_120.sa_data._2_4_) goto LAB_0016fd20;
    uv_close((uv_handle_t *)&local_100,(uv_close_cb)0x0);
    puVar3 = uv_default_loop();
    uv_run(puVar3,UV_RUN_DEFAULT);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar2 = uv_loop_close(puVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_create_early_cold_1();
LAB_0016fcfd:
    run_test_tcp_create_early_cold_2();
LAB_0016fd02:
    run_test_tcp_create_early_cold_3();
LAB_0016fd07:
    run_test_tcp_create_early_cold_10();
LAB_0016fd0c:
    run_test_tcp_create_early_cold_4();
LAB_0016fd11:
    run_test_tcp_create_early_cold_5();
LAB_0016fd16:
    run_test_tcp_create_early_cold_6();
LAB_0016fd1b:
    run_test_tcp_create_early_cold_7();
LAB_0016fd20:
    run_test_tcp_create_early_cold_8();
  }
  run_test_tcp_create_early_cold_9();
  puStack_278 = (uv_loop_t *)0x16fd43;
  puStack_138 = unaff_RBX;
  iVar2 = uv_interface_addresses((uv_interface_address_t **)&uStack_230,(int *)&sStack_25c);
  if (iVar2 != 0) {
LAB_0016fe9e:
    puStack_278 = (uv_loop_t *)0x16fea3;
    run_test_tcp_create_early_bad_bind_cold_1();
    return 1;
  }
  if ((long)(int)sStack_25c._0_4_ < 1) {
    puStack_278 = (uv_loop_t *)0x16fe9e;
    uv_free_interface_addresses((uv_interface_address_t *)uStack_230.data,sStack_25c._0_4_);
    goto LAB_0016fe9e;
  }
  paVar6 = (anon_union_28_2_e90107a3_for_address *)((long)uStack_230.data + 0x14);
  uVar4 = 1;
  do {
    uVar1 = (paVar6->address4).sin_family;
    puVar3 = (uv_loop_t *)(ulong)uVar1;
    if (uVar1 == 10) break;
    paVar6 = (anon_union_28_2_e90107a3_for_address *)((long)paVar6 + 0x50);
    bVar7 = uVar4 < (ulong)(long)(int)sStack_25c._0_4_;
    uVar4 = uVar4 + 1;
  } while (bVar7);
  puStack_278 = (uv_loop_t *)0x16fd8a;
  uv_free_interface_addresses((uv_interface_address_t *)uStack_230.data,sStack_25c._0_4_);
  if (uVar1 != 10) goto LAB_0016fe9e;
  puStack_278 = (uv_loop_t *)0x16fdaa;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_240);
  if (iVar2 == 0) {
    puStack_278 = (uv_loop_t *)0x16fdb7;
    puVar5 = uv_default_loop();
    puStack_278 = (uv_loop_t *)0x16fdc9;
    iVar2 = uv_tcp_init_ex(puVar5,&uStack_230,10);
    if (iVar2 != 0) goto LAB_0016feaf;
    puStack_278 = (uv_loop_t *)0x16fde0;
    iVar2 = uv_fileno((uv_handle_t *)&uStack_230,aiStack_264);
    if (iVar2 != 0) goto LAB_0016feb4;
    if (aiStack_264[0] == -1) goto LAB_0016feb9;
    aiStack_264[1] = UV_SIGNAL|UV_TCP;
    puStack_278 = (uv_loop_t *)0x16fe0d;
    iVar2 = uv_tcp_getsockname(&uStack_230,&sStack_25c,aiStack_264 + 1);
    if (iVar2 != 0) goto LAB_0016febe;
    if (sStack_25c.sa_family != 10) goto LAB_0016fec3;
    puVar3 = (uv_loop_t *)0x0;
    puStack_278 = (uv_loop_t *)0x16fe34;
    iVar2 = uv_tcp_bind(&uStack_230,(sockaddr *)&sStack_240,0);
    if (iVar2 != -0x16) goto LAB_0016fec8;
    puStack_278 = (uv_loop_t *)0x16fe49;
    uv_close((uv_handle_t *)&uStack_230,(uv_close_cb)0x0);
    puStack_278 = (uv_loop_t *)0x16fe4e;
    puVar5 = uv_default_loop();
    puStack_278 = (uv_loop_t *)0x16fe58;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_278 = (uv_loop_t *)0x16fe5d;
    puVar5 = uv_default_loop();
    puStack_278 = (uv_loop_t *)0x16fe71;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_278 = (uv_loop_t *)0x16fe7b;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_278 = (uv_loop_t *)0x16fe80;
    puVar5 = uv_default_loop();
    puStack_278 = (uv_loop_t *)0x16fe88;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_278 = (uv_loop_t *)0x16feaf;
    run_test_tcp_create_early_bad_bind_cold_2();
LAB_0016feaf:
    puStack_278 = (uv_loop_t *)0x16feb4;
    run_test_tcp_create_early_bad_bind_cold_3();
LAB_0016feb4:
    puStack_278 = (uv_loop_t *)0x16feb9;
    run_test_tcp_create_early_bad_bind_cold_4();
LAB_0016feb9:
    puStack_278 = (uv_loop_t *)0x16febe;
    run_test_tcp_create_early_bad_bind_cold_9();
LAB_0016febe:
    puStack_278 = (uv_loop_t *)0x16fec3;
    run_test_tcp_create_early_bad_bind_cold_5();
LAB_0016fec3:
    puStack_278 = (uv_loop_t *)0x16fec8;
    run_test_tcp_create_early_bad_bind_cold_6();
LAB_0016fec8:
    puStack_278 = (uv_loop_t *)0x16fecd;
    run_test_tcp_create_early_bad_bind_cold_7();
  }
  puStack_278 = (uv_loop_t *)run_test_tcp_create_early_bad_domain;
  run_test_tcp_create_early_bad_bind_cold_8();
  auStack_4d8._344_8_ = 0x16fedf;
  puStack_278 = puVar3;
  puVar5 = uv_default_loop();
  auStack_4d8._344_8_ = 0x16fef1;
  iVar2 = uv_tcp_init_ex(puVar5,&uStack_370,0x2f);
  if (iVar2 == -0x16) {
    auStack_4d8._344_8_ = 0x16fefb;
    puVar5 = uv_default_loop();
    auStack_4d8._344_8_ = 0x16ff0d;
    iVar2 = uv_tcp_init_ex(puVar5,&uStack_370,0x400);
    if (iVar2 != -0x16) goto LAB_0016ff65;
    auStack_4d8._344_8_ = 0x16ff17;
    puVar3 = uv_default_loop();
    auStack_4d8._344_8_ = 0x16ff21;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_4d8._344_8_ = 0x16ff26;
    puVar3 = uv_default_loop();
    auStack_4d8._344_8_ = 0x16ff3a;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    auStack_4d8._344_8_ = 0x16ff44;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_4d8._344_8_ = 0x16ff49;
    puVar5 = uv_default_loop();
    auStack_4d8._344_8_ = 0x16ff51;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    auStack_4d8._344_8_ = 0x16ff65;
    run_test_tcp_create_early_bad_domain_cold_1();
LAB_0016ff65:
    auStack_4d8._344_8_ = 0x16ff6a;
    run_test_tcp_create_early_bad_domain_cold_2();
  }
  auStack_4d8._344_8_ = run_test_tcp_create_early_accept;
  run_test_tcp_create_early_bad_domain_cold_3();
  auStack_4d8._344_8_ = puVar3;
  puVar3 = uv_default_loop();
  handle = "0.0.0.0";
  iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&uStack_5d0);
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(puVar3,(uv_tcp_t *)auStack_4d8);
    handle = (char *)puVar3;
    if (iVar2 != 0) goto LAB_0017009e;
    handle = auStack_4d8;
    iVar2 = uv_tcp_bind((uv_tcp_t *)handle,(sockaddr *)&uStack_5d0,0);
    if (iVar2 != 0) goto LAB_001700a3;
    handle = auStack_4d8;
    iVar2 = uv_listen((uv_stream_t *)handle,0x80,on_connection);
    if (iVar2 != 0) goto LAB_001700a8;
    puVar3 = uv_default_loop();
    handle = "127.0.0.1";
    iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_5e0);
    if (iVar2 != 0) goto LAB_001700ad;
    iVar2 = uv_tcp_init(puVar3,&uStack_5d0);
    if (iVar2 != 0) goto LAB_001700b2;
    puVar3 = (uv_loop_t *)(auStack_4d8 + 0xf8);
    iVar2 = uv_tcp_connect((uv_connect_t *)puVar3,&uStack_5d0,(sockaddr *)&sStack_5e0,on_connect);
    if (iVar2 == 0) {
      puVar3 = uv_default_loop();
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_001700bc;
    }
  }
  else {
    run_test_tcp_create_early_accept_cold_1();
LAB_0017009e:
    run_test_tcp_create_early_accept_cold_2();
LAB_001700a3:
    run_test_tcp_create_early_accept_cold_3();
LAB_001700a8:
    run_test_tcp_create_early_accept_cold_4();
LAB_001700ad:
    puVar3 = (uv_loop_t *)handle;
    run_test_tcp_create_early_accept_cold_5();
LAB_001700b2:
    run_test_tcp_create_early_accept_cold_6();
  }
  run_test_tcp_create_early_accept_cold_7();
LAB_001700bc:
  run_test_tcp_create_early_accept_cold_8();
  iVar2 = uv_is_closing((uv_handle_t *)puVar3);
  if (iVar2 == 0) {
    uv_close((uv_handle_t *)puVar3,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_create_early) {
  struct sockaddr_in addr;
  struct sockaddr_in sockname;
  uv_tcp_t client;
  uv_os_fd_t fd;
  int r, namelen;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init_ex(uv_default_loop(), &client, AF_INET);
  ASSERT(r == 0);

  r = uv_fileno((const uv_handle_t*) &client, &fd);
  ASSERT(r == 0);
  ASSERT(fd != INVALID_FD);

  /* Windows returns WSAEINVAL if the socket is not bound */
#ifndef _WIN32
  namelen = sizeof sockname;
  r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
  ASSERT(r == 0);
  ASSERT(sockname.sin_family == AF_INET);
#endif

  r = uv_tcp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  namelen = sizeof sockname;
  r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
  ASSERT(r == 0);
  ASSERT(memcmp(&addr.sin_addr,
                &sockname.sin_addr,
                sizeof(addr.sin_addr)) == 0);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}